

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O0

void __thiscall
xe::TestHierarchyBuilder::TestHierarchyBuilder(TestHierarchyBuilder *this,TestRoot *root)

{
  TestRoot *root_local;
  TestHierarchyBuilder *this_local;
  
  this->m_root = root;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xe::TestGroup_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_xe::TestGroup_*>_>_>
  ::map(&this->m_groupMap);
  addChildGroupsToMap(&this->m_groupMap,&root->super_TestGroup);
  return;
}

Assistant:

TestHierarchyBuilder::TestHierarchyBuilder (TestRoot* root)
	: m_root(root)
{
	addChildGroupsToMap(m_groupMap, root);
}